

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_fir_filter.cc
# Opt level: O3

void __thiscall
webrtc::SparseFIRFilter::Filter(SparseFIRFilter *this,float *in,size_t length,float *out)

{
  size_t sVar1;
  pointer pfVar2;
  ulong uVar3;
  ulong uVar4;
  float *pfVar5;
  size_t __n;
  pointer pfVar6;
  ulong uVar7;
  pointer pfVar8;
  float *pfVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  
  if (length == 0) {
    pfVar8 = (this->state_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    sVar1 = this->sparsity_;
    uVar3 = this->offset_;
    pfVar2 = (this->nonzero_coeffs_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(this->nonzero_coeffs_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar2 >> 2;
    pfVar8 = (this->state_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar9 = in + -uVar3;
    uVar10 = 0;
    pfVar6 = pfVar8;
    do {
      out[uVar10] = 0.0;
      fVar12 = 0.0;
      if (uVar10 < uVar3) {
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        uVar4 = uVar3;
        pfVar5 = pfVar9;
        do {
          if (uVar7 == uVar11) goto LAB_0014c089;
          fVar12 = fVar12 + *pfVar5 * pfVar2[uVar11];
          out[uVar10] = fVar12;
          uVar11 = uVar11 + 1;
          pfVar5 = pfVar5 + -sVar1;
          uVar4 = uVar4 + sVar1;
        } while (uVar4 <= uVar10);
      }
      if (uVar11 < uVar7) {
        pfVar5 = (float *)(((uVar7 - 1) - uVar11) * sVar1 * 4 + (long)pfVar6);
        do {
          fVar12 = fVar12 + *pfVar5 * pfVar2[uVar11];
          out[uVar10] = fVar12;
          uVar11 = uVar11 + 1;
          pfVar5 = pfVar5 + -sVar1;
        } while (uVar7 != uVar11);
      }
LAB_0014c089:
      uVar10 = uVar10 + 1;
      pfVar9 = pfVar9 + 1;
      pfVar6 = pfVar6 + 1;
    } while (uVar10 != length);
  }
  pfVar2 = (this->state_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)pfVar2 - (long)pfVar8;
  if (__n == 0) {
    return;
  }
  uVar3 = (long)pfVar2 - (long)pfVar8 >> 2;
  if (uVar3 < length || uVar3 - length == 0) {
    in = in + (length - uVar3);
  }
  else {
    memmove(pfVar8,pfVar8 + length,(uVar3 - length) * 4);
    pfVar8 = (this->state_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar8 = pfVar8 + (((ulong)((long)(this->state_).
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pfVar8) >> 2) -
                      length);
    __n = length << 2;
  }
  memcpy(pfVar8,in,__n);
  return;
}

Assistant:

void SparseFIRFilter::Filter(const float* in, size_t length, float* out) {
  // Convolves the input signal |in| with the filter kernel |nonzero_coeffs_|
  // taking into account the previous state.
  for (size_t i = 0; i < length; ++i) {
    out[i] = 0.f;
    size_t j;
    for (j = 0; i >= j * sparsity_ + offset_ &&
                j < nonzero_coeffs_.size(); ++j) {
      out[i] += in[i - j * sparsity_ - offset_] * nonzero_coeffs_[j];
    }
    for (; j < nonzero_coeffs_.size(); ++j) {
      out[i] += state_[i + (nonzero_coeffs_.size() - j - 1) * sparsity_] *
                nonzero_coeffs_[j];
    }
  }

  // Update current state.
  if (state_.size() > 0u) {
    if (length >= state_.size()) {
      std::memcpy(&state_[0],
                  &in[length - state_.size()],
                  state_.size() * sizeof(*in));
    } else {
      std::memmove(&state_[0],
                   &state_[length],
                   (state_.size() - length) * sizeof(state_[0]));
      std::memcpy(&state_[state_.size() - length], in, length * sizeof(*in));
    }
  }
}